

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpointer.hpp
# Opt level: O1

void jsoncons::jsonpointer::
     flatten_<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *parent_key,
               basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *parent_value,
               basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *result)

{
  pointer pcVar1;
  json_type jVar2;
  bool bVar3;
  size_t sVar4;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *parent_value_00;
  unsigned_long value;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *pkVar5;
  string_type key_1;
  string_type key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *local_48;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  jVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::type(parent_value);
  if (jVar2 == object_value) {
    bVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::empty(parent_value);
    if (!bVar3) {
      basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_range_abi_cxx11_
                ((const_object_range_type *)local_68,
                 (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)parent_value);
      local_48 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  *)local_58._M_allocated_capacity;
      bVar3 = local_68[8] == (bool)local_58._M_local_buf[8];
      if ((local_68[8] & local_58._M_local_buf[8] & 1U) != 0) {
        bVar3 = local_68._0_8_ == local_58._M_allocated_capacity;
      }
      if (bVar3) {
        return;
      }
      pkVar5 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                *)local_68._0_8_;
      do {
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        pcVar1 = (parent_key->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_88,pcVar1,pcVar1 + parent_key->_M_string_length);
        std::__cxx11::string::push_back((char)&local_88);
        local_40._M_str = (pkVar5->key_)._M_dataplus._M_p;
        local_40._M_len = (pkVar5->key_)._M_string_length;
        escape<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
                  (&local_40,&local_88);
        flatten_<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                  (&local_88,&pkVar5->value_,result);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        pkVar5 = pkVar5 + 1;
        bVar3 = pkVar5 == local_48;
        if ((local_68[8] & local_58._M_local_buf[8] & 1U) == 0) {
          bVar3 = local_68[8] == (bool)local_58._M_local_buf[8];
        }
      } while (!bVar3);
      return;
    }
  }
  else if ((jVar2 == array_value) &&
          (bVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::empty
                             (parent_value), !bVar3)) {
    sVar4 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(parent_value);
    if (sVar4 == 0) {
      return;
    }
    value = 0;
    do {
      pcVar1 = (parent_key->_M_dataplus)._M_p;
      local_68._0_8_ = &local_58;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_68,pcVar1,pcVar1 + parent_key->_M_string_length);
      std::__cxx11::string::push_back
                ((char)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68
                );
      jsoncons::detail::from_integer<unsigned_long,std::__cxx11::string>
                (value,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68
                );
      parent_value_00 =
           basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at(parent_value,value);
      flatten_<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                 parent_value_00,result);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._0_8_ != &local_58) {
        operator_delete((void *)local_68._0_8_,local_58._M_allocated_capacity + 1);
      }
      value = value + 1;
      sVar4 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(parent_value);
    } while (value < sVar4);
    return;
  }
  local_88._M_string_length = (size_type)(parent_key->_M_dataplus)._M_p;
  local_88._M_dataplus._M_p = (pointer)parent_key->_M_string_length;
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
  try_emplace<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>
            ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
              *)local_68,(basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)result,
             (string_view_type *)&local_88,parent_value);
  return;
}

Assistant:

void flatten_(const std::basic_string<typename Json::char_type>& parent_key,
                  const Json& parent_value,
                  Json& result)
    {
        using char_type = typename Json::char_type;
        using string_type = std::basic_string<char_type>;

        switch (parent_value.type())
        {
            case json_type::array_value:
            {
                if (parent_value.empty())
                {
                    // Flatten empty array to null
                    //result.try_emplace(parent_key, null_type{});
                    //result[parent_key] = parent_value;
                    result.try_emplace(parent_key, parent_value);
                }
                else
                {
                    for (std::size_t i = 0; i < parent_value.size(); ++i)
                    {
                        string_type key(parent_key);
                        key.push_back('/');
                        jsoncons::detail::from_integer(i,key);
                        flatten_(key, parent_value.at(i), result);
                    }
                }
                break;
            }

            case json_type::object_value:
            {
                if (parent_value.empty())
                {
                    // Flatten empty object to null
                    //result.try_emplace(parent_key, null_type{});
                    //result[parent_key] = parent_value;
                    result.try_emplace(parent_key, parent_value);
                }
                else
                {
                    for (const auto& item : parent_value.object_range())
                    {
                        string_type key(parent_key);
                        key.push_back('/');
                        escape(jsoncons::basic_string_view<char_type>(item.key().data(),item.key().size()), key);
                        flatten_(key, item.value(), result);
                    }
                }
                break;
            }

            default:
            {
                // add primitive parent_value with its reference string
                //result[parent_key] = parent_value;
                result.try_emplace(parent_key, parent_value);
                break;
            }
        }
    }